

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitSelect(PrintExpressionContents *this,Select *curr)

{
  ostream *stream;
  ulong uVar1;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  stream = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"select",6);
  Colors::outputColorCode(this->o,"\x1b[0m");
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id;
  if ((uVar1 & 1) == 0 && 6 < uVar1) {
    uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
    PrintSExpression::printPrefixedTypes
              (this->parent,"result",
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.
                     type.id);
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    prepareColor(o) << "select";
    restoreNormalColor(o);
    if (curr->type.isRef()) {
      o << ' ';
      printResultType(curr->type);
    }
  }